

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LimitSegments.cpp
# Opt level: O0

Pass * wasm::createLimitSegmentsPass(void)

{
  Pass *this;
  
  this = (Pass *)operator_new(0x58);
  memset(this,0,0x58);
  LimitSegments::LimitSegments((LimitSegments *)this);
  return this;
}

Assistant:

Pass* createLimitSegmentsPass() { return new LimitSegments(); }